

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O0

void av1_alloc_restoration_struct(AV1_COMMON *cm,RestorationInfo *rsi,int is_uv)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  int in_EDX;
  size_t in_RSI;
  AV1_COMMON *in_RDI;
  int vert_units;
  int horz_units;
  int unit_size;
  int plane_h;
  int plane_w;
  int unit_size_00;
  int in_stack_ffffffffffffffe4;
  int local_18 [2];
  
  av1_get_upsampled_plane_size(in_RDI,in_EDX,local_18,(int *)&stack0xffffffffffffffe4);
  unit_size_00 = *(int *)(in_RSI + 4);
  iVar1 = av1_lr_count_units(unit_size_00,local_18[0]);
  iVar2 = av1_lr_count_units(unit_size_00,in_stack_ffffffffffffffe4);
  *(int *)(in_RSI + 8) = iVar1 * iVar2;
  *(int *)(in_RSI + 0x10) = iVar1;
  *(int *)(in_RSI + 0xc) = iVar2;
  aom_free((void *)CONCAT44(in_stack_ffffffffffffffe4,unit_size_00));
  pvVar3 = aom_memalign((size_t)in_RDI,in_RSI);
  *(void **)(in_RSI + 0x18) = pvVar3;
  if (*(long *)(in_RSI + 0x18) == 0) {
    aom_internal_error(in_RDI->error,AOM_CODEC_MEM_ERROR,"Failed to allocate rsi->unit_info");
  }
  return;
}

Assistant:

void av1_alloc_restoration_struct(AV1_COMMON *cm, RestorationInfo *rsi,
                                  int is_uv) {
  int plane_w, plane_h;
  av1_get_upsampled_plane_size(cm, is_uv, &plane_w, &plane_h);

  const int unit_size = rsi->restoration_unit_size;
  const int horz_units = av1_lr_count_units(unit_size, plane_w);
  const int vert_units = av1_lr_count_units(unit_size, plane_h);

  rsi->num_rest_units = horz_units * vert_units;
  rsi->horz_units = horz_units;
  rsi->vert_units = vert_units;

  aom_free(rsi->unit_info);
  CHECK_MEM_ERROR(cm, rsi->unit_info,
                  (RestorationUnitInfo *)aom_memalign(
                      16, sizeof(*rsi->unit_info) * rsi->num_rest_units));
}